

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O2

int libssh2_channel_request_auth_agent(LIBSSH2_CHANNEL *channel)

{
  libssh2_nonblocking_states lVar1;
  int iVar2;
  time_t tVar3;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    return -0x27;
  }
  lVar1 = channel->req_auth_agent_try_state;
  if (lVar1 == libssh2_NB_state_idle) {
    tVar3 = time((time_t *)0x0);
    do {
      iVar2 = channel_request_auth_agent(channel,"auth-agent-req@openssh.com",0x1a);
      if (iVar2 != -0x25) break;
      iVar2 = -0x25;
      if (channel->session->api_block_mode == 0) goto LAB_00109696;
      iVar2 = _libssh2_wait_socket(channel->session,tVar3);
    } while (iVar2 == 0);
    if ((iVar2 == -0x25) || (iVar2 == 0)) {
LAB_00109696:
      lVar1 = channel->req_auth_agent_try_state;
      goto LAB_0010969c;
    }
    channel->req_auth_agent_try_state = libssh2_NB_state_sent;
LAB_001096a1:
    tVar3 = time((time_t *)0x0);
    do {
      iVar2 = channel_request_auth_agent(channel,"auth-agent-req",0xe);
      if (iVar2 != -0x25) break;
      if (channel->session->api_block_mode == 0) {
        return -0x25;
      }
      iVar2 = _libssh2_wait_socket(channel->session,tVar3);
    } while (iVar2 == 0);
    if ((iVar2 != 0) && (iVar2 != -0x25)) {
      lVar1 = libssh2_NB_state_sent1;
      goto LAB_001096fd;
    }
  }
  else {
    iVar2 = -0x17;
LAB_0010969c:
    if (lVar1 == libssh2_NB_state_sent) goto LAB_001096a1;
  }
  if (iVar2 != 0) {
    return iVar2;
  }
  lVar1 = libssh2_NB_state_idle;
  iVar2 = 0;
LAB_001096fd:
  channel->req_auth_agent_try_state = lVar1;
  return iVar2;
}

Assistant:

LIBSSH2_API int
libssh2_channel_request_auth_agent(LIBSSH2_CHANNEL *channel)
{
    int rc;

    if(!channel)
        return LIBSSH2_ERROR_BAD_USE;

    rc = LIBSSH2_ERROR_CHANNEL_UNKNOWN;

    /* The current RFC draft for agent forwarding says you're supposed to
     * send "auth-agent-req," but most SSH servers out there right now
     * actually expect "auth-agent-req@openssh.com", so we try that
     * first. */
    if(channel->req_auth_agent_try_state == libssh2_NB_state_idle) {
        BLOCK_ADJUST(rc, channel->session,
                     channel_request_auth_agent(channel,
                                                "auth-agent-req@openssh.com",
                                                26));

        /* If we failed (but not with EAGAIN), then we move onto
         * the next step to try another request type. */
        if(rc != LIBSSH2_ERROR_NONE &&
           rc != LIBSSH2_ERROR_EAGAIN)
            channel->req_auth_agent_try_state = libssh2_NB_state_sent;
    }

    if(channel->req_auth_agent_try_state == libssh2_NB_state_sent) {
        BLOCK_ADJUST(rc, channel->session,
                     channel_request_auth_agent(channel,
                                                "auth-agent-req", 14));

        /* If we failed without an EAGAIN, then move on with this
         * state machine. */
        if(rc != LIBSSH2_ERROR_NONE &&
           rc != LIBSSH2_ERROR_EAGAIN)
            channel->req_auth_agent_try_state = libssh2_NB_state_sent1;
    }

    /* If things are good, reset the try state. */
    if(rc == LIBSSH2_ERROR_NONE)
        channel->req_auth_agent_try_state = libssh2_NB_state_idle;

    return rc;
}